

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::flushTSBuffer(TSMuxer *this)

{
  AbstractOutputStream *pAVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  VodCoreException *pVVar6;
  undefined8 uVar7;
  string local_500;
  ostringstream local_4e0 [8];
  ostringstream ss_2;
  string local_360;
  ostringstream local_340 [8];
  ostringstream ss_1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  int64_t fileSize;
  TSMuxer *this_local;
  
  bVar2 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
  if (bVar2) {
    MuxerManager::waitForWriting((this->super_AbstractMuxer).m_owner);
  }
  iVar3 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[4])();
  if (CONCAT44(extraout_var,iVar3) == -1) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar5 = std::operator<<((ostream *)local_190,"Can\'t determine size for file ");
    std::operator<<(poVar5,(string *)&this->m_outFileName);
    pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar6,0x69,&local_1c0);
    __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
  pAVar1 = this->m_muxFile;
  uVar7 = std::__cxx11::string::c_str();
  uVar4 = (*(pAVar1->super_AbstractStream)._vptr_AbstractStream[2])(pAVar1,uVar7,6,0);
  if ((uVar4 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar5 = std::operator<<((ostream *)local_340,"Can\'t reopen file ");
    std::operator<<(poVar5,(string *)&this->m_outFileName);
    pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar6,0x69,&local_360);
    __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar3 = writeOutFile(this,this->m_outBuf,this->m_outBufLen);
  if (iVar3 == this->m_outBufLen) {
    if (this->m_outBuf != (uint8_t *)0x0) {
      operator_delete__(this->m_outBuf);
    }
    this->m_outBufLen = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_4e0);
  poVar5 = std::operator<<((ostream *)local_4e0,"Can\'t write last data block to file ");
  std::operator<<(poVar5,(string *)&this->m_outFileName);
  pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(pVVar6,0x69,&local_500);
  __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::flushTSBuffer()
{
    if (m_owner->isAsyncMode())
        m_owner->waitForWriting();

    const int64_t fileSize = m_muxFile->size();
    if (fileSize == -1)
        THROW(ERR_FILE_COMMON, "Can't determine size for file " << m_outFileName)
    m_muxFile->close();

    if (!m_muxFile->open(m_outFileName.c_str(), File::ofWrite + File::ofAppend))
        THROW(ERR_FILE_COMMON, "Can't reopen file " << m_outFileName)

    if (writeOutFile(m_outBuf, m_outBufLen) != m_outBufLen)
        THROW(ERR_FILE_COMMON, "Can't write last data block to file " << m_outFileName)
    delete[] m_outBuf;
    m_outBufLen = 0;
}